

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  Printer *pPVar1;
  undefined4 uVar2;
  bool bVar3;
  int iVar4;
  Syntax SVar5;
  int iVar6;
  string *psVar7;
  mapped_type *pmVar8;
  Descriptor *descriptor;
  EnumDescriptor *descriptor_00;
  char *pcVar9;
  MessageOptions *this_00;
  FileDescriptor *this_01;
  OneofOptions *this_02;
  Syntax syntax;
  int i_00;
  int i_01;
  int __c;
  int i_02;
  undefined1 local_530 [8];
  DescriptorProto edp;
  key_type local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  allocator local_3f9;
  key_type local_3f8;
  string local_3d8;
  allocator local_3b1;
  string local_3b0;
  undefined1 local_390 [8];
  string options_string_1;
  key_type local_368;
  string local_348;
  allocator local_321;
  key_type local_320;
  allocator local_2f9;
  key_type local_2f8;
  undefined1 local_2d8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m_1;
  OneofDescriptor *desc;
  undefined1 local_298 [4];
  int i_3;
  string local_278;
  ExtensionRange *local_258;
  ExtensionRange *range;
  undefined1 local_248 [4];
  int i_2;
  allocator local_221;
  string local_220;
  allocator local_1f9;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [8];
  string options_string;
  string descriptor_name;
  undefined1 local_170 [4];
  int i_1;
  string nested_name;
  char acStack_148 [4];
  int i;
  char required_function_arguments [91];
  allocator local_c1;
  key_type local_c0;
  allocator local_99;
  key_type local_98;
  undefined1 local_78 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string local_38;
  Descriptor *local_18;
  Descriptor *message_descriptor_local;
  Generator *this_local;
  
  local_18 = message_descriptor;
  message_descriptor_local = (Descriptor *)this;
  PrintNestedDescriptors(this,message_descriptor);
  io::Printer::Print(this->printer_,"\n");
  pPVar1 = this->printer_;
  ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_38,this,local_18);
  io::Printer::Print(pPVar1,"$descriptor_name$ = _descriptor.Descriptor(\n","descriptor_name",
                     &local_38);
  std::__cxx11::string::~string((string *)&local_38);
  io::Printer::Indent(this->printer_);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_78);
  psVar7 = Descriptor::name_abi_cxx11_(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"name",&local_99);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,&local_98);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  psVar7 = Descriptor::full_name_abi_cxx11_(local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"full_name",&local_c1);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar8,(string *)psVar7);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(required_function_arguments + 0x58),"file",
             (allocator *)(required_function_arguments + 0x57));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_78,(key_type *)(required_function_arguments + 0x58));
  std::__cxx11::string::operator=((string *)pmVar8,"DESCRIPTOR");
  std::__cxx11::string::~string((string *)(required_function_arguments + 0x58));
  std::allocator<char>::~allocator((allocator<char> *)(required_function_arguments + 0x57));
  builtin_strncpy(required_function_arguments + 0x48,"ype=None,\n",0xb);
  builtin_strncpy(required_function_arguments + 0x38,"e$,\ncontaining_t",0x10);
  builtin_strncpy(required_function_arguments + 0x28,"=None,\nfile=$fil",0x10);
  builtin_strncpy(required_function_arguments + 0x18,"name$\',\nfilename",0x10);
  builtin_strncpy(required_function_arguments + 8,"ull_name=\'$full_",0x10);
  builtin_strncpy(acStack_148,"name",4);
  i._0_1_ = '=';
  i._1_1_ = '\'';
  i._2_1_ = '$';
  i._3_1_ = 'n';
  builtin_strncpy(required_function_arguments,"ame$\',\nf",8);
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_78,acStack_148);
  PrintFieldsInDescriptor(this,local_18);
  PrintExtensionsInDescriptor(this,local_18);
  io::Printer::Print(this->printer_,"nested_types=[");
  nested_name.field_2._12_4_ = 0;
  while( true ) {
    uVar2 = nested_name.field_2._12_4_;
    iVar4 = Descriptor::nested_type_count(local_18);
    if (iVar4 <= (int)uVar2) break;
    descriptor = Descriptor::nested_type(local_18,nested_name.field_2._12_4_);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>((string *)local_170,this,descriptor);
    io::Printer::Print(this->printer_,"$name$, ","name",(string *)local_170);
    std::__cxx11::string::~string((string *)local_170);
    nested_name.field_2._12_4_ = nested_name.field_2._12_4_ + 1;
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"enum_types=[\n");
  io::Printer::Indent(this->printer_);
  descriptor_name.field_2._12_4_ = 0;
  while( true ) {
    iVar4 = Descriptor::enum_type_count(local_18);
    if (iVar4 <= (int)descriptor_name.field_2._12_4_) break;
    descriptor_00 = Descriptor::enum_type(local_18,descriptor_name.field_2._12_4_);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              ((string *)((long)&options_string.field_2 + 8),this,descriptor_00);
    pPVar1 = this->printer_;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    io::Printer::Print(pPVar1,pcVar9);
    io::Printer::Print(this->printer_,",\n");
    std::__cxx11::string::~string((string *)(options_string.field_2._M_local_buf + 8));
    descriptor_name.field_2._12_4_ = descriptor_name.field_2._12_4_ + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  std::__cxx11::string::string((string *)local_1b8);
  this_00 = Descriptor::options(local_18);
  MessageLite::SerializeToString((MessageLite *)this_00,(string *)local_1b8);
  pPVar1 = this->printer_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1f8,"MessageOptions",&local_1f9);
  OptionsValue(&local_1d8,this,&local_1f8,(string *)local_1b8);
  iVar4 = Descriptor::extension_range_count(local_18);
  pcVar9 = "False";
  if (0 < iVar4) {
    pcVar9 = "True";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_220,pcVar9,&local_221);
  this_01 = Descriptor::file(local_18);
  SVar5 = FileDescriptor::syntax(this_01);
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            ((string *)local_248,(_anonymous_namespace_ *)(ulong)SVar5,syntax);
  io::Printer::Print(pPVar1,
                     "options=$options_value$,\nis_extendable=$extendable$,\nsyntax=\'$syntax$\'",
                     "options_value",&local_1d8,"extendable",&local_220,"syntax",(string *)local_248
                    );
  std::__cxx11::string::~string((string *)local_248);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  io::Printer::Print(this->printer_,",\n");
  io::Printer::Print(this->printer_,"extension_ranges=[");
  range._4_4_ = 0;
  while( true ) {
    iVar4 = range._4_4_;
    iVar6 = Descriptor::extension_range_count(local_18);
    if (iVar6 <= iVar4) break;
    local_258 = Descriptor::extension_range(local_18,range._4_4_);
    pPVar1 = this->printer_;
    SimpleItoa_abi_cxx11_(&local_278,(protobuf *)(ulong)(uint)local_258->start,i_00);
    SimpleItoa_abi_cxx11_((string *)local_298,(protobuf *)(ulong)(uint)local_258->end,i_01);
    io::Printer::Print(pPVar1,"($start$, $end$), ","start",&local_278,"end",(string *)local_298);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)&local_278);
    range._4_4_ = range._4_4_ + 1;
  }
  io::Printer::Print(this->printer_,"],\n");
  io::Printer::Print(this->printer_,"oneofs=[\n");
  io::Printer::Indent(this->printer_);
  desc._4_4_ = 0;
  while( true ) {
    iVar4 = Descriptor::oneof_decl_count(local_18);
    if (iVar4 <= desc._4_4_) break;
    m_1._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)Descriptor::oneof_decl(local_18,desc._4_4_);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)local_2d8);
    psVar7 = OneofDescriptor::name_abi_cxx11_
                       ((OneofDescriptor *)m_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_2f8,"name",&local_2f9);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2d8,&local_2f8);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
    psVar7 = OneofDescriptor::full_name_abi_cxx11_
                       ((OneofDescriptor *)m_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_320,"full_name",&local_321);
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2d8,&local_320);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)psVar7);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator((allocator<char> *)&local_321);
    pcVar9 = OneofDescriptor::index
                       ((OneofDescriptor *)m_1._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (char *)psVar7,__c);
    SimpleItoa_abi_cxx11_(&local_348,(protobuf *)((ulong)pcVar9 & 0xffffffff),i_02);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_368,"index",
               (allocator *)(options_string_1.field_2._M_local_buf + 0xf));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_2d8,&local_368);
    std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_348);
    std::__cxx11::string::~string((string *)&local_368);
    std::allocator<char>::~allocator
              ((allocator<char> *)(options_string_1.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3b0,"OneofOptions",&local_3b1);
    this_02 = OneofDescriptor::options
                        ((OneofDescriptor *)m_1._M_t._M_impl.super__Rb_tree_header._M_node_count);
    MessageLite::SerializeAsString_abi_cxx11_(&local_3d8,(MessageLite *)this_02);
    OptionsValue((string *)local_390,this,&local_3b0,&local_3d8);
    std::__cxx11::string::~string((string *)&local_3d8);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_390,"None");
    if (bVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3f8,"options",&local_3f9);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_2d8,&local_3f8);
      std::__cxx11::string::operator=((string *)pmVar8,"");
      std::__cxx11::string::~string((string *)&local_3f8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    }
    else {
      std::operator+(&local_420,", options=",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_440,"options",(allocator *)((long)&edp.options_ + 7));
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_2d8,&local_440);
      std::__cxx11::string::operator=((string *)pmVar8,(string *)&local_420);
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator((allocator<char> *)((long)&edp.options_ + 7));
      std::__cxx11::string::~string((string *)&local_420);
    }
    io::Printer::Print(this->printer_,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_2d8,
                       "_descriptor.OneofDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\',\n  index=$index$, containing_type=None, fields=[]$options$),\n"
                      );
    std::__cxx11::string::~string((string *)local_390);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_2d8);
    desc._4_4_ = desc._4_4_ + 1;
  }
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,"],\n");
  DescriptorProto::DescriptorProto((DescriptorProto *)local_530);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this,local_18,(DescriptorProto *)local_530);
  io::Printer::Outdent(this->printer_);
  io::Printer::Print(this->printer_,")\n");
  DescriptorProto::~DescriptorProto((DescriptorProto *)local_530);
  std::__cxx11::string::~string((string *)local_1b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_78);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  std::map<string, string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const string nested_name = ModuleLevelDescriptorName(
        *message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const string descriptor_name = ModuleLevelDescriptorName(
        *message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "options=$options_value$,\n"
      "is_extendable=$extendable$,\n"
      "syntax='$syntax$'",
      "options_value", OptionsValue("MessageOptions", options_string),
      "extendable", message_descriptor.extension_range_count() > 0 ?
                      "True" : "False",
      "syntax", StringifySyntax(message_descriptor.file()->syntax()));
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ",
                    "start", SimpleItoa(range->start),
                    "end", SimpleItoa(range->end));
  }
  printer_->Print("],\n");
  printer_->Print("oneofs=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.oneof_decl_count(); ++i) {
    const OneofDescriptor* desc = message_descriptor.oneof_decl(i);
    std::map<string, string> m;
    m["name"] = desc->name();
    m["full_name"] = desc->full_name();
    m["index"] = SimpleItoa(desc->index());
    string options_string =
        OptionsValue("OneofOptions", desc->options().SerializeAsString());
    if (options_string == "None") {
      m["options"] = "";
    } else {
      m["options"] = ", options=" + options_string;
    }
    printer_->Print(
        m,
        "_descriptor.OneofDescriptor(\n"
        "  name='$name$', full_name='$full_name$',\n"
        "  index=$index$, containing_type=None, fields=[]$options$),\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}